

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

void str_ncopy(char *to,char *from,int maxchars)

{
  int in_EDX;
  char *in_RSI;
  char *in_RDI;
  
  if (in_RSI == (char *)0x0) {
    *in_RDI = '\0';
  }
  else {
    strncpy(in_RDI,in_RSI,(long)in_EDX);
    in_RDI[in_EDX + -1] = '\0';
  }
  return;
}

Assistant:

private void str_ncopy(to, from, maxchars)
    char    *to;        /* space to copy to */
    char    *from;        /* space to copy from */
    int        maxchars;    /* max # of chars (including NUL) copied */
{
    if (from == (char *)NULL)
    {
        to[0] = '\0';
        return;
    }

    /* copy up to maxchars chars */
    (void)strncpy(to, from, maxchars);

    /* ensure to is NUL-terminated */
    to[maxchars-1] = '\0';
}